

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcpaddress.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPTCPAddress::IsSameAddress(RTPTCPAddress *this,RTPAddress *addr)

{
  AddressType AVar1;
  RTPTCPAddress *a;
  RTPAddress *addr_local;
  RTPTCPAddress *this_local;
  
  if (addr == (RTPAddress *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    AVar1 = RTPAddress::GetAddressType(addr);
    if (AVar1 == TCPAddress) {
      if (*(int *)&addr->field_0xc == *(int *)&(this->super_RTPAddress).field_0xc) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RTPTCPAddress::IsSameAddress(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != TCPAddress)
		return false;

	const RTPTCPAddress *a = static_cast<const RTPTCPAddress *>(addr);

	// We're using a socket to identify connections
	if (a->m_socket == m_socket)
		return true;

	return false;
}